

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cont.c
# Opt level: O2

void model_init(model *m)

{
  ggml_context *pgVar1;
  ggml_backend_t pgVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  ggml_cgraph *pgVar6;
  ggml_init_params params0;
  
  pgVar1 = make_ctx();
  m->ctx = pgVar1;
  pgVar2 = (ggml_backend_t)ggml_backend_cpu_init();
  m->backend = pgVar2;
  lVar3 = ggml_tensor_overhead();
  lVar4 = ggml_graph_overhead();
  puVar5 = (uint8_t *)calloc(lVar4 + lVar3 * 0x800,1);
  m->buf = puVar5;
  pgVar1 = (ggml_context *)ggml_init();
  m->ctx0 = pgVar1;
  pgVar6 = (ggml_cgraph *)ggml_new_graph(pgVar1);
  m->gf = pgVar6;
  return;
}

Assistant:

void model_init(struct model* m) {
    m->ctx = make_ctx();
    m->backend = make_backend();

    size_t buf_size = ggml_tensor_overhead() * GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead();
    m->buf = calloc(buf_size, sizeof(uint8_t));
    struct ggml_init_params params0 = {
        .mem_size = buf_size,
        .mem_buffer = m->buf,
        .no_alloc = true,
    };
    m->ctx0 = ggml_init(params0);
    m->gf = ggml_new_graph(m->ctx0);
}